

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void ps_astar_node2itor(astar_seg_t *itor)

{
  ps_latnode_t *ppVar1;
  char *local_28;
  ps_latnode_t *node;
  ps_seg_t *seg;
  astar_seg_t *itor_local;
  
  if (itor->cur < itor->n_nodes) {
    ppVar1 = itor->nodes[itor->cur];
    if (itor->cur == itor->n_nodes + -1) {
      (itor->base).ef = ppVar1->lef;
    }
    else {
      (itor->base).ef = itor->nodes[itor->cur + 1]->sf + -1;
    }
    if (ppVar1->wid < 0) {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = ((itor->base).search)->dict->word[ppVar1->wid].word;
    }
    (itor->base).text = local_28;
    (itor->base).wid = ppVar1->wid;
    (itor->base).sf = ppVar1->sf;
    (itor->base).prob = 0;
    return;
  }
  __assert_fail("itor->cur < itor->n_nodes",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x742,"void ps_astar_node2itor(astar_seg_t *)");
}

Assistant:

static void
ps_astar_node2itor(astar_seg_t *itor)
{
    ps_seg_t *seg = (ps_seg_t *)itor;
    ps_latnode_t *node;

    assert(itor->cur < itor->n_nodes);
    node = itor->nodes[itor->cur];
    if (itor->cur == itor->n_nodes - 1)
        seg->ef = node->lef;
    else
        seg->ef = itor->nodes[itor->cur + 1]->sf - 1;
    seg->text = dict_wordstr(ps_search_dict(seg->search), node->wid);
    seg->wid = node->wid;
    seg->sf = node->sf;
    seg->prob = 0; /* FIXME: implement forward-backward */
}